

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O1

TestStatus *
vkt::synchronization::anon_unknown_0::testSemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  void *pvVar3;
  VkDevice_s *device_00;
  TestStatus *pTVar4;
  VkResult VVar5;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  deUint32 *pdVar6;
  ostream *poVar7;
  NotSupportedError *this;
  VkQueue queue;
  VkQueue queue_00;
  long lVar8;
  ulong uVar9;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  deUint32 queueFamilyIndex;
  ulong uVar11;
  bool bVar12;
  Move<vk::VkDevice_s_*> device;
  VkPipelineStageFlags waitDstStageMask;
  Unique<vk::Handle<(vk::HandleType)4>_> semaphore;
  VkSubmitInfo submitInfo [2];
  Vec4 vertices1 [3];
  VkMappedMemoryRange range;
  TestContext testContext2;
  TestContext testContext1;
  Vec4 vertices2 [3];
  DeviceDriver deviceInterface;
  SimpleAllocator allocator;
  Move<vk::VkDevice_s_*> local_e58;
  TestLog *local_e38;
  string local_e30;
  VkPipelineStageFlags local_e0c;
  string local_e08;
  TestStatus *local_de8;
  TextureFormat local_de0;
  VkSemaphore local_dd8;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_dd0;
  undefined1 local_db8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_da8;
  _Alloc_hider local_d98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d88 [4];
  ios_base local_d40 [200];
  undefined4 auStack_c78 [2];
  undefined8 uStack_c70;
  undefined4 auStack_c68 [2];
  undefined8 auStack_c60 [2];
  undefined4 auStack_c50 [4];
  undefined4 auStack_c40 [2];
  undefined1 local_c38 [48];
  Move<vk::VkCommandBuffer_s_*> *local_c08;
  deUint32 local_c00;
  VkSemaphore *local_bf8;
  VkSubmitInfo local_bf0;
  Vec4 local_ba8;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  ConstPixelBufferAccess local_b78;
  VkMappedMemoryRange local_b50;
  TestContext local_b28;
  undefined1 local_948 [328];
  Move<vk::VkCommandBuffer_s_*> local_800 [6];
  Vec4 local_738;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  DeviceDriver local_708;
  SimpleAllocator local_250;
  
  local_e38 = context->m_testCtx->m_log;
  local_de8 = __return_storage_ptr__;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  local_ba8.m_data[0] = 1.0;
  local_ba8.m_data[1] = 1.0;
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_c38,vk,physicalDevice);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)&local_250,vk,physicalDevice);
  if (local_c38._8_8_ - local_c38._0_8_ != 0) {
    uVar9 = ((long)(local_c38._8_8_ - local_c38._0_8_) >> 3) * -0x5555555555555555;
    pdVar6 = (deUint32 *)(local_c38._0_8_ + 4);
    bVar12 = true;
    uVar11 = 0;
    do {
      if (((((VkQueueFamilyProperties *)(pdVar6 + -1))->queueFlags & 1) != 0) && (1 < *pdVar6)) {
        if (bVar12) {
          local_948._24_8_ = &local_b28;
          local_b28.vkd = (DeviceInterface *)0xcdcdcdcd00000002;
          local_b28.device = (VkDevice)0x0;
          queueFamilyIndex = (deUint32)uVar11;
          local_b28._16_8_ = uVar11 << 0x20;
          local_b28.binaryCollection = (BinaryCollection *)0xcdcdcdcd00000002;
          local_948._52_4_ = 0xcdcdcdcd;
          local_948._0_8_ = (DeviceInterface *)0xcdcdcdcd00000003;
          local_948._8_8_ = (VkDevice)0x0;
          local_948._16_4_ = 0;
          local_948._20_4_ = 1;
          local_948._48_4_ = 0;
          local_948._56_4_ = 0;
          local_948._60_4_ = 0;
          local_948._32_8_ = (Allocator *)0xcdcdcdcd00000000;
          local_948._40_8_ = (Vec4 *)0x0;
          local_b28.allocator = (Allocator *)&local_ba8;
          local_948._64_8_ = &local_250;
          ::vk::createDevice(&local_e58,vk,physicalDevice,(VkDeviceCreateInfo *)local_948,
                             (VkAllocationCallbacks *)0x0);
          if ((pointer)local_c38._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_c38._0_8_,local_c38._16_8_ - local_c38._0_8_);
          }
          ::vk::DeviceDriver::DeviceDriver
                    (&local_708,vk,local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object);
          device_00 = local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object;
          ::vk::getPhysicalDeviceMemoryProperties
                    ((VkPhysicalDeviceMemoryProperties *)local_948,vk,physicalDevice);
          ::vk::SimpleAllocator::SimpleAllocator
                    (&local_250,&local_708.super_DeviceInterface,device_00,
                     (VkPhysicalDeviceMemoryProperties *)local_948);
          queue = ::vk::getDeviceQueue
                            (&local_708.super_DeviceInterface,
                             local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                             queueFamilyIndex,0);
          queue_00 = ::vk::getDeviceQueue
                               (&local_708.super_DeviceInterface,
                                local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                                queueFamilyIndex,1);
          TestContext::TestContext
                    ((TestContext *)local_948,&local_708.super_DeviceInterface,
                     local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,
                     context->m_progCollection,&local_250.super_Allocator);
          TestContext::TestContext
                    (&local_b28,&local_708.super_DeviceInterface,
                     local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,
                     context->m_progCollection,&local_250.super_Allocator);
          ::vk::createSemaphore
                    ((Move<vk::Handle<(vk::HandleType)4>_> *)local_db8,
                     &local_708.super_DeviceInterface,
                     local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
                     (VkAllocationCallbacks *)0x0);
          DStack_dd0.m_device = (VkDevice)local_da8._M_allocated_capacity;
          DStack_dd0.m_allocator = (VkAllocationCallbacks *)local_da8._8_8_;
          local_dd8.m_internal = local_db8._0_8_;
          DStack_dd0.m_deviceIface = (DeviceInterface *)local_db8._8_8_;
          local_e0c = 1;
          local_ba8.m_data[0] = 0.5;
          local_ba8.m_data[1] = 0.5;
          local_ba8.m_data[2] = 0.0;
          local_ba8.m_data[3] = 1.0;
          local_b98 = 0x3f000000bf000000;
          uStack_b90 = 0x3f80000000000000;
          local_b88 = 0xbf00000000000000;
          uStack_b80 = 0x3f80000000000000;
          local_b28.vertices = &local_738;
          local_738.m_data[0] = -0.5;
          local_738.m_data[1] = -0.5;
          local_738.m_data[2] = 0.0;
          local_738.m_data[3] = 1.0;
          local_728 = 0xbf0000003f000000;
          uStack_720 = 0x3f80000000000000;
          local_718 = 0x3f00000000000000;
          uStack_710 = 0x3f80000000000000;
          local_948._48_4_ = 3;
          local_948._52_4_ = 0x100;
          local_948._56_4_ = 0x100;
          local_948._80_8_ = 0x40000;
          local_b28.numVertices = 3;
          local_b28.renderDimension.m_data[0] = 0x100;
          local_b28.renderDimension.m_data[1] = 0x100;
          local_b28.renderSize = 0x40000;
          local_948._40_8_ = &local_ba8;
          createCommandBuffer(&local_708.super_DeviceInterface,
                              local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                              queueFamilyIndex,local_800,
                              (Move<vk::Handle<(vk::HandleType)24>_> *)(local_948 + 0x128));
          pTVar4 = local_de8;
          generateWork((TestContext *)local_948);
          createCommandBuffer(&local_708.super_DeviceInterface,
                              local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                              queueFamilyIndex,&local_b28.cmdBuffer,&local_b28.commandPool);
          generateWork(&local_b28);
          lVar8 = 0x40;
          do {
            *(undefined4 *)((long)auStack_c78 + lVar8) = 4;
            *(undefined8 *)((long)&uStack_c70 + lVar8) = 0;
            *(undefined4 *)((long)auStack_c68 + lVar8) = 0;
            *(undefined8 *)((long)auStack_c60 + lVar8) = 0;
            *(undefined8 *)((long)auStack_c60 + lVar8 + 8) = 0;
            *(undefined4 *)((long)auStack_c50 + lVar8) = 1;
            *(undefined4 *)((long)auStack_c40 + lVar8) = 0;
            *(undefined8 *)(local_c38 + lVar8) = 0;
            lVar8 = lVar8 + 0x48;
          } while (lVar8 != 0xd0);
          local_c00 = 1;
          local_bf8 = &local_dd8;
          local_bf0.waitSemaphoreCount = 1;
          local_bf0.pWaitDstStageMask = &local_e0c;
          local_c08 = local_800;
          local_bf0.pWaitSemaphores = local_bf8;
          local_bf0.pCommandBuffers = (VkCommandBuffer *)&local_b28.cmdBuffer;
          VVar5 = ::vk::DeviceDriver::queueSubmit
                            (&local_708,queue,1,(VkSubmitInfo *)local_c38,(VkFence)local_948._64_8_)
          ;
          ::vk::checkResult(VVar5,
                            "deviceInterface.queueSubmit(queue[0], 1, &submitInfo[0], testContext1.fences[0])"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                            ,0x494);
          VVar5 = ::vk::DeviceDriver::waitForFences
                            (&local_708,local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                             (VkFence *)(local_948 + 0x40),1,0xffffffffffffffff);
          if (VVar5 == VK_SUCCESS) {
            local_b50.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
            local_b50.pNext = (void *)0x0;
            local_b50.memory.m_internal = ((VkDeviceMemory *)(local_948._88_8_ + 8))->m_internal;
            local_b50.offset = 0;
            local_b50.size = local_948._80_8_;
            VVar5 = ::vk::DeviceDriver::invalidateMappedMemoryRanges
                              (&local_708,local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                               &local_b50);
            ::vk::checkResult(VVar5,
                              "deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                              ,0x4a2);
            pvVar3 = *(void **)(local_948._88_8_ + 0x18);
            local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e30,"result","");
            paVar1 = &local_e08.field_2;
            local_e08._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e08,"result","");
            local_de0.order = RGBA;
            local_de0.type = UNORM_INT8;
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      (&local_b78,&local_de0,local_948._52_4_,local_948._56_4_,1,pvVar3);
            pCVar10 = &local_b78;
            tcu::LogImage::LogImage
                      ((LogImage *)local_db8,&local_e30,&local_e08,pCVar10,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_db8,(int)local_e38,__buf,(size_t)pCVar10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d98._M_p != local_d88) {
              operator_delete(local_d98._M_p,local_d88[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_db8._0_8_ != &local_da8) {
              operator_delete((void *)local_db8._0_8_,local_da8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e08._M_dataplus._M_p != paVar1) {
              operator_delete(local_e08._M_dataplus._M_p,local_e08.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
              operator_delete(local_e30._M_dataplus._M_p,local_e30.field_2._M_allocated_capacity + 1
                             );
            }
            VVar5 = ::vk::DeviceDriver::queueSubmit
                              (&local_708,queue_00,1,&local_bf0,local_b28.fences[0]);
            ::vk::checkResult(VVar5,
                              "deviceInterface.queueSubmit(queue[1], 1, &submitInfo[1], testContext2.fences[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                              ,0x4ae);
            VVar5 = ::vk::DeviceDriver::waitForFences
                              (&local_708,local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                               local_b28.fences,1,0xffffffffffffffff);
            if (VVar5 == VK_SUCCESS) {
              local_b50.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
              local_b50.pNext = (void *)0x0;
              local_b50.memory.m_internal =
                   ((local_b28.renderReadBuffer.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal;
              local_b50.offset = 0;
              local_b50.size = local_b28.renderSize;
              VVar5 = ::vk::DeviceDriver::invalidateMappedMemoryRanges
                                (&local_708,local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                                 1,&local_b50);
              ::vk::checkResult(VVar5,
                                "deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                                ,0x4bc);
              pvVar3 = (local_b28.renderReadBuffer.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_hostPtr;
              local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e30,"result","");
              local_e08._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e08,"result","");
              local_de0.order = RGBA;
              local_de0.type = UNORM_INT8;
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&local_b78,&local_de0,local_b28.renderDimension.m_data[0],
                         local_b28.renderDimension.m_data[1],1,pvVar3);
              pCVar10 = &local_b78;
              tcu::LogImage::LogImage
                        ((LogImage *)local_db8,&local_e30,&local_e08,pCVar10,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)local_db8,(int)local_e38,__buf_00,(size_t)pCVar10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d98._M_p != local_d88) {
                operator_delete(local_d98._M_p,local_d88[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_db8._0_8_ != &local_da8) {
                operator_delete((void *)local_db8._0_8_,local_da8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e08._M_dataplus._M_p != paVar1) {
                operator_delete(local_e08._M_dataplus._M_p,
                                local_e08.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
                operator_delete(local_e30._M_dataplus._M_p,
                                local_e30.field_2._M_allocated_capacity + 1);
              }
              local_db8._0_8_ = &local_da8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_db8,"synchronization-semaphores passed","");
              pTVar4->m_code = QP_TEST_RESULT_PASS;
              (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar4->m_description,local_db8._0_8_,
                         (char *)(local_db8._0_8_ + (long)(_func_int ***)local_db8._8_8_));
            }
            else {
              poVar2 = (ostringstream *)(local_db8 + 8);
              local_db8._0_8_ = local_e38;
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar2,"testSynchPrimitives failed to wait for a set fence",0x32
                        );
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_db8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              std::ios_base::~ios_base(local_d40);
              local_db8._0_8_ = &local_da8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_db8,"failed to wait for a set fence","");
              pTVar4->m_code = QP_TEST_RESULT_FAIL;
              (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar4->m_description,local_db8._0_8_,
                         (char *)(local_db8._0_8_ + (long)(_func_int ***)local_db8._8_8_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_db8._0_8_ == &local_da8) goto LAB_007ee206;
          }
          else {
            poVar2 = (ostringstream *)(local_db8 + 8);
            local_db8._0_8_ = local_e38;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"testSynchPrimitives failed to wait for a set fence",0x32);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_db8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base(local_d40);
            local_db8._0_8_ = &local_da8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_db8,"failed to wait for a set fence","");
            pTVar4->m_code = QP_TEST_RESULT_FAIL;
            (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pTVar4->m_description,local_db8._0_8_,
                       (char *)(local_db8._0_8_ + (long)(_func_int ***)local_db8._8_8_));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_db8._0_8_ == &local_da8) goto LAB_007ee206;
          }
          operator_delete((void *)local_db8._0_8_,local_da8._M_allocated_capacity + 1);
LAB_007ee206:
          if (local_dd8.m_internal != 0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                      (&DStack_dd0,local_dd8);
          }
          TestContext::~TestContext(&local_b28);
          TestContext::~TestContext((TestContext *)local_948);
          ::vk::DeviceDriver::~DeviceDriver(&local_708);
          if (local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
            (*local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                      (local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                       local_e58.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
          }
          return pTVar4;
        }
        break;
      }
      uVar11 = uVar11 + 1;
      bVar12 = uVar11 < uVar9;
      pdVar6 = pdVar6 + 6;
    } while (uVar9 + (uVar9 == 0) != uVar11);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_708);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_708,"Cannot create device with ",0x1a);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_708);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," graphics queues",0x10);
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::NotSupportedError::NotSupportedError(this,(string *)local_db8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus testSemaphores (Context& context)
{
	TestLog&					log					= context.getTestContext().getLog();
	const InstanceInterface&	instanceInterface	= context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice		= context.getPhysicalDevice();
	deUint32					queueFamilyIdx;
	vk::Move<VkDevice>			device				= createTestDevice(instanceInterface, physicalDevice, &queueFamilyIdx);
	const DeviceDriver			deviceInterface		(instanceInterface, *device);
	SimpleAllocator				allocator			(deviceInterface,
													 *device,
													 getPhysicalDeviceMemoryProperties(instanceInterface, physicalDevice));
	const VkQueue				queue[2]			=
	{
		getDeviceQueue(deviceInterface, *device, queueFamilyIdx, 0),
		getDeviceQueue(deviceInterface, *device, queueFamilyIdx, 1)
	};
	VkResult					testStatus;
	TestContext					testContext1		(deviceInterface, device.get(), queueFamilyIdx, context.getBinaryCollection(), allocator);
	TestContext					testContext2		(deviceInterface, device.get(), queueFamilyIdx, context.getBinaryCollection(), allocator);
	Unique<VkSemaphore>			semaphore			(createSemaphore(deviceInterface, *device));
	VkSubmitInfo				submitInfo[2];
	VkMappedMemoryRange			range;
	void*						resultImage;
	const VkPipelineStageFlags	waitDstStageMask	= VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;

	const tcu::Vec4		vertices1[]			=
	{
		tcu::Vec4( 0.5f,  0.5f, 0.0f, 1.0f),
		tcu::Vec4(-0.5f,  0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, -0.5f, 0.0f, 1.0f)
	};

	const tcu::Vec4		vertices2[]			=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	testContext1.vertices			= vertices1;
	testContext1.numVertices		= DE_LENGTH_OF_ARRAY(vertices1);
	testContext1.renderDimension	= tcu::IVec2(256, 256);
	testContext1.renderSize			= sizeof(deUint32) * testContext1.renderDimension.x() * testContext1.renderDimension.y();

	testContext2.vertices			= vertices2;
	testContext2.numVertices		= DE_LENGTH_OF_ARRAY(vertices2);
	testContext2.renderDimension	= tcu::IVec2(256, 256);
	testContext2.renderSize			= sizeof(deUint32) * testContext2.renderDimension.x() * testContext2.renderDimension.y();

	createCommandBuffer(deviceInterface, device.get(), queueFamilyIdx, &testContext1.cmdBuffer, &testContext1.commandPool);
	generateWork(testContext1);

	createCommandBuffer(deviceInterface, device.get(), queueFamilyIdx, &testContext2.cmdBuffer, &testContext2.commandPool);
	generateWork(testContext2);

	initSubmitInfo(submitInfo, DE_LENGTH_OF_ARRAY(submitInfo));

	// The difference between the two submit infos is that each will use a unique cmd buffer,
	// and one will signal a semaphore but not wait on a semaphore, the other will wait on the
	// semaphore but not signal a semaphore
	submitInfo[0].pCommandBuffers		= &testContext1.cmdBuffer.get();
	submitInfo[1].pCommandBuffers		= &testContext2.cmdBuffer.get();

	submitInfo[0].signalSemaphoreCount	= 1;
	submitInfo[0].pSignalSemaphores		= &semaphore.get();
	submitInfo[1].waitSemaphoreCount	= 1;
	submitInfo[1].pWaitSemaphores		= &semaphore.get();
	submitInfo[1].pWaitDstStageMask		= &waitDstStageMask;

	VK_CHECK(deviceInterface.queueSubmit(queue[0], 1, &submitInfo[0], testContext1.fences[0]));

	testStatus  = deviceInterface.waitForFences(device.get(), 1, &testContext1.fences[0], true, std::numeric_limits<deUint64>::max());
	if (testStatus != VK_SUCCESS)
	{
		log << TestLog::Message << "testSynchPrimitives failed to wait for a set fence" << TestLog::EndMessage;
		return tcu::TestStatus::fail("failed to wait for a set fence");
	}

	range.sType			= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
	range.pNext			= DE_NULL;
	range.memory		= testContext1.renderReadBuffer->getMemory();
	range.offset		= 0;
	range.size			= testContext1.renderSize;
	VK_CHECK(deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range));
	resultImage = testContext1.renderReadBuffer->getHostPtr();

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									testContext1.renderDimension.x(),
									testContext1.renderDimension.y(),
									1,
									resultImage));

	VK_CHECK(deviceInterface.queueSubmit(queue[1], 1, &submitInfo[1], testContext2.fences[0]));

	testStatus  = deviceInterface.waitForFences(device.get(), 1, &testContext2.fences[0], true, std::numeric_limits<deUint64>::max());
	if (testStatus != VK_SUCCESS)
	{
		log << TestLog::Message << "testSynchPrimitives failed to wait for a set fence" << TestLog::EndMessage;
		return tcu::TestStatus::fail("failed to wait for a set fence");
	}

	range.sType			= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
	range.pNext			= DE_NULL;
	range.memory		= testContext2.renderReadBuffer->getMemory();
	range.offset		= 0;
	range.size			= testContext2.renderSize;
	VK_CHECK(deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range));
	resultImage = testContext2.renderReadBuffer->getHostPtr();

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									testContext2.renderDimension.x(),
									testContext2.renderDimension.y(),
									1,
									resultImage));

	return tcu::TestStatus::pass("synchronization-semaphores passed");
}